

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall maths::Matrix::readSolutionsFromRREF(Matrix *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  double **ppdVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  Matrix special;
  Matrix particular;
  Matrix R;
  Matrix local_40;
  
  Matrix(&R,this);
  bVar5 = true;
  lVar9 = 0;
  bVar7 = false;
  do {
    if ((bVar7) || (this->rows_ <= lVar9)) {
      if (!bVar7) {
        poVar2 = std::operator<<(os,"UNIQUE SOLUTION");
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      if (bVar5) {
        Matrix(&particular,this->cols_ + -1,1);
        Matrix(&special,this->cols_ + -1,1);
        for (lVar9 = 0; lVar9 < this->rows_; lVar9 = lVar9 + 1) {
          lVar10 = 0;
          bVar5 = false;
          bVar7 = false;
          while( true ) {
            lVar1 = (long)this->cols_ + -1;
            if (lVar1 <= lVar10) break;
            dVar11 = R.p[lVar9][lVar10];
            if ((dVar11 != 0.0) || (NAN(dVar11))) {
              if (bVar5) {
                if (!bVar7) {
                  Matrix(&local_40,(int)lVar1,1);
                  operator=(&special,&local_40);
                  ~Matrix(&local_40);
                  dVar11 = R.p[lVar9][lVar10];
                }
                dVar11 = -dVar11;
                bVar7 = true;
                ppdVar3 = special.p;
              }
              else {
                dVar11 = R.p[lVar9][(long)this->cols_ + -1];
                ppdVar3 = particular.p;
              }
              *ppdVar3[lVar10] = dVar11;
              bVar5 = true;
            }
            lVar10 = lVar10 + 1;
          }
          poVar2 = std::operator<<(os,"Special solution:");
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          operator<<(poVar2,&special);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        poVar2 = std::operator<<(os,"Particular solution:");
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        operator<<(poVar2,&particular);
        std::endl<char,std::char_traits<char>>(poVar2);
        ~Matrix(&special);
        ~Matrix(&particular);
      }
      ~Matrix(&R);
      return;
    }
    uVar4 = this->cols_ - 1;
    uVar6 = 0;
    if (0 < (int)uVar4) {
      uVar6 = (ulong)uVar4;
    }
    bVar7 = true;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      bVar7 = (bool)(bVar7 & R.p[lVar9][uVar8] == 0.0);
    }
    if (bVar7) {
      if ((R.p[lVar9][(long)this->cols_ + -1] != 0.0) || (NAN(R.p[lVar9][(long)this->cols_ + -1])))
      {
        poVar2 = std::operator<<(os,"NO SOLUTIONS");
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        bVar7 = true;
        bVar5 = false;
      }
      else {
LAB_00114718:
        poVar2 = std::operator<<(os,"INFINITE SOLUTIONS");
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        bVar7 = true;
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    else {
      if (this->rows_ < (int)uVar4) goto LAB_00114718;
      bVar7 = false;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void Matrix::readSolutionsFromRREF(ostream& os)
{
    Matrix R(*this);

    // print number of solutions
    bool hasSolutions = true;
    bool doneSearching = false;
    int i = 0;
    while (!doneSearching && i < rows_)
    {
        bool allZeros = true;
        for (int j = 0; j < cols_ - 1; ++j) {
            if (R(i, j) != 0)
                allZeros = false;
        }
        if (allZeros && R(i, cols_ - 1) != 0) {
            hasSolutions = false;
            os << "NO SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (allZeros && R(i, cols_ - 1) == 0) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (rows_ < cols_ - 1) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        }
        i++;
    }
    if (!doneSearching)
        os << "UNIQUE SOLUTION" << endl << endl;

    // get solutions if they exist
    if (hasSolutions)
    {
        Matrix particular(cols_ - 1, 1);
        Matrix special(cols_ - 1, 1);

        for (int i = 0; i < rows_; ++i) {
            bool pivotFound = false;
            bool specialCreated = false;
            for (int j = 0; j < cols_ - 1; ++j) {
                if (R(i, j) != 0) {
                    // if pivot variable, add b to particular
                    if (!pivotFound) {
                        pivotFound = true;
                        particular(j, 0) = R(i, cols_ - 1);
                    } else { // otherwise, add to special solution
                        if (!specialCreated) {
                            special = Matrix(cols_ - 1, 1);
                            specialCreated = true;
                        }
                        special(j, 0) = -1 * R(i, j);
                    }
                }
            }
            os << "Special solution:" << endl << special << endl;
        }
        os << "Particular solution:" << endl << particular << endl;
    }
}